

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_avl.c
# Opt level: O2

void do_tests(_Bool do_random)

{
  list_entity **pplVar1;
  int iVar2;
  undefined1 *puVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  list_entity *plVar7;
  list_entity *plVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  undefined1 uVar12;
  char *pcVar13;
  undefined7 in_register_00000039;
  uint uVar14;
  avl_tree *paVar15;
  uint uVar16;
  tree_element *ptVar17;
  uint local_6c;
  tree_element *local_68;
  long local_60;
  list_entity *local_58;
  long local_50;
  long local_48;
  undefined8 local_40;
  uint32_t local_38;
  uint32_t local_34;
  
  uVar9 = CONCAT71(in_register_00000039,do_random);
  uVar16 = (uint)uVar9;
  pcVar13 = "non ";
  if (uVar16 != 0) {
    pcVar13 = "";
  }
  printf("Do %srandom tests.\n",pcVar13);
  cunit_start_test("test_insert_nondup");
  uVar12 = 0x28;
  avl_init(&head,avl_comp_uint32,0);
  add_elements((tree_element *)(uVar9 & 0xffffffff),(_Bool)uVar12);
  cunit_named_check(head.count == 6,"test_insert_nondup",0xef,"tree not completely filled");
  check_tree("test_insert_nondup",0xf0);
  ptVar17 = nodes;
  additional_node1.value = nodes[3].value;
  additional_node1.node.key = &additional_node1;
  iVar2 = avl_insert(&head,0x108278);
  cunit_named_check(iVar2 != 0,"test_insert_nondup",0xf6,
                    "insert duplicate (in non-dup tree) was successful");
  cunit_named_check(head.count == 6,"test_insert_nondup",0xf8,
                    "tree not completely filled after insert");
  check_tree("test_insert_nondup",0xf9);
  cunit_end_test("test_insert_nondup");
  cunit_start_test("test_insert_dup");
  uVar12 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(uVar9 & 0xffffffff),(_Bool)uVar12);
  cunit_named_check(head.count == 6,"test_insert_dup",0x103,"tree not completely filled");
  check_tree("test_insert_dup",0x104);
  additional_node1.value = nodes[3].value;
  additional_node1.node.key = &additional_node1;
  iVar2 = avl_insert(&head,0x108278);
  cunit_named_check(iVar2 == 0,"test_insert_dup",0x10a,
                    "insert duplicate (in dup tree) was not successful");
  cunit_named_check(head.count == 7,"test_insert_dup",0x10d,
                    "tree not completely filled after insert");
  check_tree("test_insert_dup",0x10e);
  cunit_end_test("test_insert_dup");
  cunit_start_test("test_find");
  uVar12 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(uVar9 & 0xffffffff),(_Bool)uVar12);
  for (uVar9 = 0; uVar9 != 6; uVar9 = uVar9 + 1) {
    puVar3 = (undefined1 *)avl_find(&head,ptVar17);
    cunit_named_check(&ptVar17->node == (avl_node *)puVar3,"test_find",0x11d,
                      "node of element %d not found",uVar9 & 0xffffffff);
    lVar4 = avl_find(&head,ptVar17);
    cunit_named_check(ptVar17 == (tree_element *)(lVar4 + -8) && lVar4 != 0,"test_find",0x11e,
                      "element %d not found",uVar9 & 0xffffffff);
    ptVar17 = ptVar17 + 1;
  }
  local_6c = 0xff;
  paVar15 = &head;
  lVar4 = avl_find(&head,&local_6c);
  cunit_named_check(lVar4 == 0,"test_find",0x121,"non-existing element found: %d",(ulong)local_6c);
  additional_node1.value = nodes[3].value;
  additional_node1.node.key = &additional_node1;
  iVar2 = avl_insert(&head,0x108278);
  cunit_named_check(iVar2 == 0,"test_find",0x126,"insert duplicate (in dup tree) was not successful"
                   );
  for (local_6c = 0; local_6c < 6; local_6c = local_6c + 1) {
    lVar4 = avl_find(&head,nodes + local_6c);
    cunit_named_check(lVar4 != 0,"test_find",0x12a,"element %d not found",(ulong)local_6c);
  }
  local_6c = 0xff;
  lVar4 = avl_find(&head,&local_6c);
  cunit_named_check(lVar4 == 0,"test_find",0x12d,"non-existing element found: %d",(ulong)local_6c);
  cunit_end_test("test_find");
  cunit_start_test("test_delete_nondup");
  uVar12 = 0x28;
  avl_init(&head,avl_comp_uint32,0);
  add_elements((tree_element *)(ulong)(uVar16 & 0xff),(_Bool)uVar12);
  local_40 = 0x108178;
  avl_remove(&head,0x108178);
  cunit_named_check(head.count == 5,"test_delete_nondup",0x139,"tree has wrong count after delete");
  check_tree("test_delete_nondup",0x13a);
  cunit_end_test("test_delete_nondup");
  cunit_start_test("test_delete_dup");
  uVar12 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  uVar10 = uVar16 & 0xff;
  add_elements((tree_element *)(ulong)(uVar16 & 0xff),(_Bool)uVar12);
  local_48 = 0x1081b0;
  additional_node1.value = nodes[3].value;
  additional_node1.node.key = &additional_node1;
  local_50 = 0x108278;
  iVar2 = avl_insert(&head);
  cunit_named_check(iVar2 == 0,"test_delete_dup",0x148,
                    "insert duplicate (in dup tree) was not successful");
  local_60 = 0x1081b8;
  avl_remove(&head);
  cunit_named_check(head.count == 6,"test_delete_dup",0x14b,
                    "tree has wrong count after delete of one duplicate");
  check_tree("test_delete_dup",0x14c);
  cunit_end_test("test_delete_dup");
  cunit_start_test("test_greaterequal");
  uVar12 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(ulong)uVar10,(_Bool)uVar12);
  avl_remove(&head,0x108178);
  local_38 = 2;
  lVar4 = avl_find_greaterequal(&head,&local_38);
  local_58 = &nodes[1].node.list;
  cunit_named_check(lVar4 == 0x108138,"test_greaterequal",0x15c,"node of element >= 2 not found");
  lVar4 = avl_find_greaterequal(&head,&local_38);
  local_68 = nodes + 1;
  cunit_named_check(lVar4 == 0x108138,"test_greaterequal",0x15d,"element >= 2 not found");
  local_38 = 3;
  lVar5 = avl_find_greaterequal(&head,&local_38);
  lVar4 = local_60;
  cunit_named_check(lVar5 == local_60,"test_greaterequal",0x161,"node of element >= 3 not found");
  lVar6 = avl_find_greaterequal(&head,&local_38);
  lVar5 = local_48;
  cunit_named_check(lVar6 + -8 == local_48 && lVar6 != 0,"test_greaterequal",0x162,
                    "element >= 3 not found");
  local_38 = 4;
  lVar6 = avl_find_greaterequal(&head,&local_38);
  cunit_named_check(lVar6 == lVar4,"test_greaterequal",0x166,"node of element >= 4 not found");
  lVar4 = avl_find_greaterequal(&head,&local_38);
  cunit_named_check(lVar4 + -8 == lVar5 && lVar4 != 0,"test_greaterequal",0x167,
                    "element >= 4 not found");
  local_38 = 0xff;
  lVar4 = avl_find_greaterequal(&head,&local_38);
  cunit_named_check(lVar4 == 0,"test_greaterequal",0x16b,"node of element >= 255 found");
  lVar4 = avl_find_greaterequal(&head,&local_38);
  cunit_named_check(lVar4 == 0,"test_greaterequal",0x16c,"element >= 255 found");
  additional_node1.node.key = &additional_node1;
  additional_node1.value = 4;
  avl_insert(&head,local_50);
  local_38 = 2;
  plVar7 = (list_entity *)avl_find_greaterequal(&head,&local_38);
  cunit_named_check(plVar7 == local_58,"test_greaterequal",0x175,
                    "node of element >= 2 not found (d)");
  lVar4 = avl_find_greaterequal(&head,&local_38);
  cunit_named_check(lVar4 == 0x108138,"test_greaterequal",0x176,"element >= 2 not found (d)");
  local_38 = 3;
  lVar6 = avl_find_greaterequal(&head,&local_38);
  lVar4 = local_60;
  cunit_named_check(lVar6 == local_60,"test_greaterequal",0x17a,"node of element >= 3 not found (d)"
                   );
  lVar6 = avl_find_greaterequal(&head,&local_38);
  cunit_named_check(lVar6 + -8 == lVar5 && lVar6 != 0,"test_greaterequal",0x17b,
                    "element >= 3 not found (d)");
  local_38 = 4;
  lVar6 = avl_find_greaterequal(&head,&local_38);
  cunit_named_check(lVar6 == lVar4,"test_greaterequal",0x17f,"node of element >= 4 not found (d)");
  lVar4 = avl_find_greaterequal(&head,&local_38);
  cunit_named_check(lVar4 + -8 == lVar5 && lVar4 != 0,"test_greaterequal",0x180,
                    "element >= 4 not found (d)");
  local_38 = 0xff;
  lVar4 = avl_find_greaterequal(&head,&local_38);
  cunit_named_check(lVar4 == 0,"test_greaterequal",0x184,"node of element >= 255 found (d)");
  lVar4 = avl_find_greaterequal(&head,&local_38);
  cunit_named_check(lVar4 == 0,"test_greaterequal",0x185,"element >= 255 found (d)");
  cunit_end_test("test_greaterequal");
  cunit_start_test("test_lessequal");
  uVar12 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(ulong)uVar10,(_Bool)uVar12);
  avl_remove(&head,local_40);
  local_34 = 0;
  lVar4 = avl_find_lessequal(&head,&local_34);
  cunit_named_check(lVar4 == 0,"test_lessequal",0x195,"node of element <= 0 found");
  lVar4 = avl_find_lessequal(&head,&local_34);
  cunit_named_check(lVar4 == 0,"test_lessequal",0x196,"element <= 0 found");
  local_34 = 2;
  plVar8 = (list_entity *)avl_find_lessequal(&head,&local_34);
  plVar7 = local_58;
  cunit_named_check(plVar8 == local_58,"test_lessequal",0x19a,"node of element <= 2 not found");
  lVar4 = avl_find_lessequal(&head,&local_34);
  ptVar17 = local_68;
  cunit_named_check((tree_element *)(lVar4 + -8) == local_68 && lVar4 != 0,"test_lessequal",0x19b,
                    "element <= 2 not found");
  local_34 = 3;
  plVar8 = (list_entity *)avl_find_lessequal(&head,&local_34);
  cunit_named_check(plVar8 == plVar7,"test_lessequal",0x19f,"node of element <= 3 not found");
  lVar4 = avl_find_lessequal(&head,&local_34);
  cunit_named_check((tree_element *)(lVar4 + -8) == ptVar17 && lVar4 != 0,"test_lessequal",0x1a0,
                    "element <= 3 not found");
  local_34 = 4;
  lVar4 = avl_find_lessequal(&head,&local_34);
  cunit_named_check(lVar4 == local_60,"test_lessequal",0x1a4,"node of element <= 4 not found");
  lVar4 = avl_find_lessequal(&head,&local_34);
  cunit_named_check(lVar4 + -8 == lVar5 && lVar4 != 0,"test_lessequal",0x1a5,
                    "element <= 4 not found");
  lVar4 = local_50;
  additional_node1.node.key = &additional_node1;
  additional_node1.value = 4;
  avl_insert(&head,local_50);
  local_34 = 0;
  lVar5 = avl_find_lessequal(&head,&local_34);
  cunit_named_check(lVar5 == 0,"test_lessequal",0x1ae,"node of element <= 0 found (d)");
  lVar5 = avl_find_lessequal(&head,&local_34);
  cunit_named_check(lVar5 == 0,"test_lessequal",0x1af,"element <= 0 found (d)");
  local_34 = 2;
  plVar8 = (list_entity *)avl_find_lessequal(&head,&local_34);
  cunit_named_check(plVar8 == plVar7,"test_lessequal",0x1b3,"node of element <= 2 not found (d)");
  lVar5 = avl_find_lessequal(&head,&local_34);
  ptVar17 = local_68;
  cunit_named_check((tree_element *)(lVar5 + -8) == local_68 && lVar5 != 0,"test_lessequal",0x1b4,
                    "element <= 2 not found (d)");
  local_34 = 3;
  plVar8 = (list_entity *)avl_find_lessequal(&head,&local_34);
  cunit_named_check(plVar8 == plVar7,"test_lessequal",0x1b8,"node of element <= 3 not found (d)");
  lVar5 = avl_find_lessequal(&head,&local_34);
  cunit_named_check((tree_element *)(lVar5 + -8) == ptVar17 && lVar5 != 0,"test_lessequal",0x1b9,
                    "element <= 3 not found (d)");
  local_34 = 4;
  lVar5 = avl_find_lessequal(&head,&local_34);
  cunit_named_check(lVar5 == lVar4,"test_lessequal",0x1bd,
                    "node of element <= 4 not found correctly (d)");
  lVar4 = avl_find_lessequal(&head,&local_34);
  cunit_named_check(lVar4 == 0x108278,"test_lessequal",0x1be,"element <= 4 not found correctly (d)")
  ;
  cunit_end_test("test_lessequal");
  cunit_start_test("test_conditions");
  avl_init(&head,avl_comp_uint32,1);
  uVar12 = 0xcd;
  cunit_named_check(head.count == 0,"test_conditions",0x1c7,"tree should be empty");
  add_elements((tree_element *)(ulong)uVar10,(_Bool)uVar12);
  cunit_named_check(head.count != 0,"test_conditions",0x1ca,"tree should not be empty");
  cunit_named_check((avl_node *)head.list_head.next == &nodes[0].node,"test_conditions",0x1cc,
                    "element 1 should be first");
  cunit_named_check(head.list_head.next != plVar7,"test_conditions",0x1cd,
                    "element 2 should not be first");
  cunit_named_check((avl_node *)head.list_head.prev == &nodes[5].node,"test_conditions",0x1cf,
                    "element %d should be first",6);
  cunit_named_check((avl_node *)head.list_head.prev != &nodes[0].node,"test_conditions",0x1d0,
                    "element 1 should not be first");
  cunit_end_test("test_conditions");
  cunit_start_test("test_element_functions");
  uVar12 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(ulong)uVar10,(_Bool)uVar12);
  cunit_named_check((avl_node *)head.list_head.next == &nodes[0].node,"test_element_functions",0x1dc
                    ,"Element 1 should be first");
  cunit_named_check((avl_node *)head.list_head.prev == &nodes[5].node,"test_element_functions",0x1dd
                    ,"Element %d should be first",6);
  ptVar17 = local_68;
  cunit_named_check((tree_element *)&nodes[0].node.list.next[-1].prev == local_68,
                    "test_element_functions",0x1df,"Element 2 is not next of element 1");
  cunit_named_check((tree_element *)&nodes[2].node.list.prev[-1].prev == ptVar17,
                    "test_element_functions",0x1e0,"Element 2 is not prev of element 3");
  cunit_end_test("test_element_functions");
  cunit_start_test("test_for_each_macros");
  uVar12 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(ulong)uVar10,(_Bool)uVar12);
  uVar9 = 0;
  while( true ) {
    paVar15 = (avl_tree *)(paVar15->list_head).next;
    if ((paVar15->list_head).prev == head.list_head.prev) break;
    cunit_named_check((tree_element *)&paVar15[-1].comp == nodes + uVar9,"test_for_each_macros",
                      0x1ee,"for_each iteration %d failed",uVar9);
    uVar9 = (ulong)((int)uVar9 + 1);
  }
  cunit_named_check((int)uVar9 == 6,"test_for_each_macros",0x1f1,
                    "for_each only had %d of %d iterations",uVar9,6);
  ptVar17 = (tree_element *)0x108130;
  uVar16 = 0;
  while ((ptVar17->node).list.prev != (list_entity *)0x1081f8) {
    uVar16 = uVar16 + 1;
    cunit_named_check(ptVar17 == nodes + uVar16,"test_for_each_macros",0x1f5,
                      "for_element_range iteration %d failed",(ulong)uVar16);
    ptVar17 = (tree_element *)&(ptVar17->node).list.next[-1].prev;
  }
  uVar11 = 4;
  cunit_named_check(uVar16 == 4,"test_for_each_macros",0x1f8,
                    "for_element_range only had %d of %d iterations",(ulong)uVar16,4);
  ptVar17 = (tree_element *)0x108130;
  uVar16 = 0;
  while ((ptVar17->node).list.prev != head.list_head.prev) {
    uVar16 = uVar16 + 1;
    cunit_named_check(ptVar17 == nodes + uVar16,"test_for_each_macros",0x1fc,
                      "element_to_last iteration %d failed",(ulong)uVar16);
    ptVar17 = (tree_element *)&(ptVar17->node).list.next[-1].prev;
  }
  uVar14 = 5;
  cunit_named_check(uVar16 == 5,"test_for_each_macros",0x1ff,
                    "element_to_last only had %d of %d iterations",(ulong)uVar16,5);
  paVar15 = &head;
  uVar9 = 0xffffffffffffffff;
  while( true ) {
    paVar15 = (avl_tree *)(paVar15->list_head).next;
    if ((paVar15->list_head).prev == (list_entity *)0x1081f8) break;
    uVar16 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar16;
    cunit_named_check((tree_element *)&paVar15[-1].comp == nodes + uVar9,"test_for_each_macros",
                      0x203,"first_to_element iteration %d failed",(ulong)uVar16);
  }
  cunit_named_check((int)uVar9 == 4,"test_for_each_macros",0x206,
                    "first_to_element only had %d of %d iterations",uVar9 & 0xffffffff,5);
  cunit_end_test("test_for_each_macros");
  cunit_start_test("test_for_each_reverse_macros");
  uVar12 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(ulong)uVar10,(_Bool)uVar12);
  plVar7 = &head.list_head;
  uVar9 = 0;
  while( true ) {
    plVar7 = plVar7->prev;
    if (plVar7->next == head.list_head.next) break;
    cunit_named_check((tree_element *)&plVar7[-1].prev == nodes + uVar14,
                      "test_for_each_reverse_macros",0x215,"for_each iteration %d failed",uVar9);
    uVar9 = (ulong)((int)uVar9 + 1);
    uVar14 = uVar14 - 1;
  }
  cunit_named_check(uVar14 == 0xffffffff,"test_for_each_reverse_macros",0x219,
                    "for_each only had %d of %d iterations",uVar9,6);
  ptVar17 = (tree_element *)0x1081f0;
  uVar16 = 0;
  while ((ptVar17->node).list.next != (list_entity *)0x108138) {
    uVar16 = uVar16 + 1;
    cunit_named_check(ptVar17 == nodes + uVar11,"test_for_each_reverse_macros",0x21e,
                      "for_element_range iteration %d failed",(ulong)uVar16);
    uVar11 = uVar11 - 1;
    ptVar17 = (tree_element *)&(ptVar17->node).list.prev[-1].prev;
  }
  uVar14 = 4;
  cunit_named_check(uVar11 == 0,"test_for_each_reverse_macros",0x222,
                    "for_element_range only had %d of %d iterations",(ulong)uVar16,4);
  plVar7 = &head.list_head;
  uVar16 = 5;
  uVar11 = 0;
  while( true ) {
    plVar7 = plVar7->prev;
    if (plVar7->next == (list_entity *)0x108138) break;
    uVar11 = uVar11 + 1;
    cunit_named_check((tree_element *)&plVar7[-1].prev == nodes + uVar16,
                      "test_for_each_reverse_macros",0x227,"element_to_last iteration %d failed",
                      (ulong)uVar11);
    uVar16 = uVar16 - 1;
  }
  cunit_named_check(uVar16 == 0,"test_for_each_reverse_macros",0x22b,
                    "element_to_last only had %d of %d iterations",(ulong)uVar11,5);
  ptVar17 = (tree_element *)0x1081f0;
  uVar9 = 0xffffffffffffffff;
  while( true ) {
    if ((ptVar17->node).list.next == head.list_head.next) break;
    uVar9 = (ulong)((int)uVar9 + 1);
    cunit_named_check(ptVar17 == nodes + uVar14,"test_for_each_reverse_macros",0x230,
                      "first_to_element iteration %d failed",uVar9);
    uVar14 = uVar14 - 1;
    ptVar17 = (tree_element *)&(ptVar17->node).list.prev[-1].prev;
  }
  uVar16 = 5;
  cunit_named_check(uVar14 == 0xffffffff,"test_for_each_reverse_macros",0x234,
                    "first_to_element only had %d of %d iterations",uVar9 & 0xffffffff,5);
  cunit_end_test("test_for_each_reverse_macros");
  cunit_start_test("test_for_each_save_macro");
  uVar12 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(ulong)uVar10,(_Bool)uVar12);
  uVar9 = 0;
  plVar7 = head.list_head.next;
  while (plVar7->prev != head.list_head.prev) {
    plVar8 = plVar7->next;
    cunit_named_check((tree_element *)&plVar7[-1].prev == nodes + uVar9,"test_for_each_save_macro",
                      0x243,"for_each_save iteration %d failed",uVar9);
    avl_remove(&head,plVar7);
    uVar9 = (ulong)((int)uVar9 + 1);
    plVar7 = plVar8;
  }
  cunit_named_check((int)uVar9 == 6,"test_for_each_save_macro",0x247,
                    "for_each_save only had %d of %d iterations",uVar9,6);
  cunit_named_check(head.count == 0,"test_for_each_save_macro",0x248,
                    "for_each_save tree not empty after loop with delete");
  cunit_end_test("test_for_each_save_macro");
  cunit_start_test("test_for_each_reverse_save_macro");
  uVar12 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(ulong)uVar10,(_Bool)uVar12);
  uVar9 = 0;
  plVar7 = head.list_head.prev;
  while( true ) {
    if (plVar7->next == head.list_head.next) break;
    plVar8 = plVar7->prev;
    cunit_named_check((tree_element *)&plVar7[-1].prev == nodes + uVar16,
                      "test_for_each_reverse_save_macro",599,"for_each_save iteration %d failed",
                      uVar9);
    avl_remove(&head,plVar7);
    uVar9 = (ulong)((int)uVar9 + 1);
    uVar16 = uVar16 - 1;
    plVar7 = plVar8;
  }
  cunit_named_check(uVar16 == 0xffffffff,"test_for_each_reverse_save_macro",0x25c,
                    "for_each_save only had %d of %d iterations",uVar9,6);
  cunit_named_check(head.count == 0,"test_for_each_reverse_save_macro",0x25d,
                    "for_each_save tree not empty after loop with delete");
  cunit_end_test("test_for_each_reverse_save_macro");
  cunit_start_test("test_remove_all_macro");
  uVar12 = 0x28;
  avl_init(&head,avl_comp_uint32,1);
  add_elements((tree_element *)(ulong)uVar10,(_Bool)uVar12);
  plVar7 = head.list_head.next;
  pplVar1 = &(head.list_head.next)->next;
  head.list_head.prev = &head.list_head;
  head.list_head.next = &head.list_head;
  head.root = (avl_node *)0x0;
  uVar9 = 0;
  plVar8 = *pplVar1;
  for (; head.count != 0; head.count = head.count - 1) {
    cunit_named_check((tree_element *)&plVar7[-1].prev == nodes + uVar9,"test_remove_all_macro",
                      0x26b,"for_each_save iteration %u failed",uVar9);
    uVar9 = (ulong)((int)uVar9 + 1);
    plVar7 = plVar8;
    plVar8 = plVar8->next;
  }
  cunit_named_check((int)uVar9 == 6,"test_remove_all_macro",0x26e,
                    "remove_all only had %u of %u iterations",uVar9,6);
  cunit_named_check(head.count == 0,"test_remove_all_macro",0x26f,
                    "remove_all tree not empty after loop with delete");
  check_tree("test_remove_all_macro",0x271);
  cunit_end_test("test_remove_all_macro");
  return;
}

Assistant:

static void do_tests(bool do_random) {
  printf("Do %srandom tests.\n", do_random ? "" : "non ");

  test_insert_nondup(do_random);
  test_insert_dup(do_random);
  test_find(do_random);
  test_delete_nondup(do_random);
  test_delete_dup(do_random);
  test_greaterequal(do_random);
  test_lessequal(do_random);
  test_conditions(do_random);
  test_element_functions(do_random);
  test_for_each_macros(do_random);
  test_for_each_reverse_macros(do_random);
  test_for_each_save_macro(do_random);
  test_for_each_reverse_save_macro(do_random);
  test_remove_all_macro(do_random);
}